

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

bool __thiscall
ON_Extrusion::Split(ON_Extrusion *this,int dir,double c,ON_Surface **west_or_south_side,
                   ON_Surface **east_or_north_side)

{
  double dVar1;
  double t0_00;
  double t1_00;
  double x;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  double *pdVar6;
  ON_Curve *local_168;
  ON_Curve *this_profile;
  ON_Curve *right_profile;
  ON_Curve *left_profile;
  ON_3dPoint P;
  double t;
  double t1;
  double t0;
  ON_Interval right_t;
  ON_Interval left_t;
  ON_Interval right_domain;
  ON_Interval left_domain;
  undefined1 auStack_c8 [8];
  ON_Line right_path;
  ON_Line left_path;
  bool rc;
  ON_Extrusion *pOStack_60;
  int path_dir;
  ON_Extrusion *right;
  ON_Extrusion *left;
  double s;
  ON_Interval domain;
  ON_Surface **east_or_north_side_local;
  ON_Surface **west_or_south_side_local;
  double c_local;
  int dir_local;
  ON_Extrusion *this_local;
  
  if (((dir < 0) || (1 < dir)) ||
     (domain.m_t[1] = (double)east_or_north_side, bVar3 = ON_IsValid(c), !bVar3)) {
    this_local._7_1_ = 0;
  }
  else if ((*west_or_south_side == (ON_Surface *)0x0) ||
          (*west_or_south_side != *(ON_Surface **)domain.m_t[1])) {
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
    dVar1 = ON_Interval::NormalizedParameterAt((ON_Interval *)&s,c);
    if ((dVar1 <= 0.0) || (1.0 <= dVar1)) {
      this_local._7_1_ = 0;
    }
    else {
      pdVar6 = ON_Interval::operator[]((ON_Interval *)&s,0);
      if ((c <= *pdVar6) || (pdVar6 = ON_Interval::operator[]((ON_Interval *)&s,1), *pdVar6 <= c)) {
        this_local._7_1_ = 0;
      }
      else {
        right = (ON_Extrusion *)0x0;
        pOStack_60 = (ON_Extrusion *)0x0;
        if ((*west_or_south_side == (ON_Surface *)0x0) ||
           (right = Cast((ON_Object *)*west_or_south_side), right != (ON_Extrusion *)0x0)) {
          if ((*(long *)domain.m_t[1] == 0) ||
             (pOStack_60 = Cast(*(ON_Object **)domain.m_t[1]), pOStack_60 != (ON_Extrusion *)0x0)) {
            iVar4 = PathParameter(this);
            bVar2 = 0;
            if (dir == iVar4) {
              ON_Line::ON_Line((ON_Line *)&right_path.to.z);
              ON_Line::ON_Line((ON_Line *)auStack_c8);
              ON_Interval::ON_Interval((ON_Interval *)(right_domain.m_t + 1));
              ON_Interval::ON_Interval((ON_Interval *)(left_t.m_t + 1));
              ON_Interval::ON_Interval((ON_Interval *)(right_t.m_t + 1));
              ON_Interval::ON_Interval((ON_Interval *)&t0);
              t0_00 = ON_Interval::operator[](&this->m_t,0);
              t1_00 = ON_Interval::operator[](&this->m_t,1);
              x = (1.0 - dVar1) * t0_00 + dVar1 * t1_00;
              bVar3 = ON_IsValid(x);
              if (((!bVar3) || (x <= t0_00)) || (t1_00 <= x)) {
                this_local._7_1_ = 0;
                P.z._4_4_ = 1;
              }
              else {
                ON_Line::PointAt((ON_3dPoint *)&left_profile,&this->m_path,dVar1);
                right_path.to.z = (this->m_path).from.x;
                right_path.from.y = P.y;
                auStack_c8 = (undefined1  [8])left_profile;
                right_path.from.x = P.x;
                right_path.to.y = (this->m_path).to.z;
                right_path.from.z = (this->m_path).to.x;
                right_path.to.x = (this->m_path).to.y;
                pdVar6 = ON_Interval::operator[]((ON_Interval *)&s,0);
                ON_Interval::Set((ON_Interval *)(right_domain.m_t + 1),*pdVar6,c);
                pdVar6 = ON_Interval::operator[]((ON_Interval *)&s,1);
                ON_Interval::Set((ON_Interval *)(left_t.m_t + 1),c,*pdVar6);
                ON_Interval::Set((ON_Interval *)(right_t.m_t + 1),t0_00,x);
                ON_Interval::Set((ON_Interval *)&t0,x,t1_00);
                bVar3 = ON_Line::IsValid((ON_Line *)&right_path.to.z);
                if ((!bVar3) ||
                   (dVar1 = ON_Line::Length((ON_Line *)&right_path.to.z),
                   dVar1 <= 2.3283064365386963e-10)) {
                  this_local._7_1_ = 0;
                  P.z._4_4_ = 1;
                }
                else {
                  bVar3 = ON_Line::IsValid((ON_Line *)auStack_c8);
                  if ((!bVar3) ||
                     (dVar1 = ON_Line::Length((ON_Line *)auStack_c8),
                     dVar1 <= 2.3283064365386963e-10)) {
                    this_local._7_1_ = 0;
                    P.z._4_4_ = 1;
                  }
                  else {
                    if (right == (ON_Extrusion *)0x0) {
                      right = (ON_Extrusion *)operator_new(0xd0);
                      ON_Extrusion(right,this);
                    }
                    else if (right == this) {
                      (*(right->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                        [0x17])(right,1);
                    }
                    else {
                      operator=(right,this);
                    }
                    if (pOStack_60 == (ON_Extrusion *)0x0) {
                      pOStack_60 = (ON_Extrusion *)operator_new(0xd0);
                      ON_Extrusion(pOStack_60,this);
                    }
                    else if (pOStack_60 == this) {
                      (*(pOStack_60->super_ON_Surface).super_ON_Geometry.super_ON_Object.
                        _vptr_ON_Object[0x17])(pOStack_60,1);
                    }
                    else {
                      operator=(pOStack_60,this);
                    }
                    memcpy(&right->m_path,&right_path.to.z,0x30);
                    (right->m_path_domain).m_t[0] = right_domain.m_t[1];
                    (right->m_path_domain).m_t[1] = left_domain.m_t[0];
                    (right->m_t).m_t[0] = right_t.m_t[1];
                    (right->m_t).m_t[1] = left_t.m_t[0];
                    memcpy(&pOStack_60->m_path,auStack_c8,0x30);
                    (pOStack_60->m_path_domain).m_t[0] = left_t.m_t[1];
                    (pOStack_60->m_path_domain).m_t[1] = right_domain.m_t[0];
                    (pOStack_60->m_t).m_t[0] = t0;
                    (pOStack_60->m_t).m_t[1] = right_t.m_t[0];
                    *west_or_south_side = &right->super_ON_Surface;
                    *(ON_Extrusion **)domain.m_t[1] = pOStack_60;
                    bVar2 = 1;
                    P.z._4_4_ = 0;
                  }
                }
              }
              ON_Line::~ON_Line((ON_Line *)auStack_c8);
              ON_Line::~ON_Line((ON_Line *)&right_path.to.z);
              if (P.z._4_4_ != 0) goto LAB_004f6833;
            }
            else {
              if (this->m_profile == (ON_Curve *)0x0) {
                this_local._7_1_ = 0;
                goto LAB_004f6833;
              }
              right_profile = (ON_Curve *)0x0;
              this_profile = (ON_Curve *)0x0;
              if (right == this) {
                right_profile = right->m_profile;
                (*(right->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])
                          (right,1);
              }
              else if ((right != (ON_Extrusion *)0x0) && (right->m_profile != (ON_Curve *)0x0)) {
                if (right->m_profile != (ON_Curve *)0x0) {
                  (*(right->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
                }
                right->m_profile = (ON_Curve *)0x0;
              }
              if (pOStack_60 == this) {
                this_profile = pOStack_60->m_profile;
                (*(pOStack_60->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                  [0x17])(pOStack_60,1);
              }
              else if ((pOStack_60 != (ON_Extrusion *)0x0) &&
                      (pOStack_60->m_profile != (ON_Curve *)0x0)) {
                if (pOStack_60->m_profile != (ON_Curve *)0x0) {
                  (*(pOStack_60->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])()
                  ;
                }
                pOStack_60->m_profile = (ON_Curve *)0x0;
              }
              uVar5 = (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3e])
                                (SUB84(c,0),this->m_profile,&right_profile,&this_profile);
              if ((uVar5 & 1) == 0) {
                this_local._7_1_ = 0;
                goto LAB_004f6833;
              }
              if ((right_profile == (ON_Curve *)0x0) || (this_profile == (ON_Curve *)0x0)) {
                if ((right_profile != (ON_Curve *)0x0) &&
                   ((this->m_profile != right_profile && (right_profile != (ON_Curve *)0x0)))) {
                  (*(right_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
                }
                if (((this_profile != (ON_Curve *)0x0) && (this->m_profile != this_profile)) &&
                   (this_profile != (ON_Curve *)0x0)) {
                  (*(this_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
                }
                this_local._7_1_ = 0;
                goto LAB_004f6833;
              }
              local_168 = (ON_Curve *)0x0;
              if ((right_profile != this->m_profile) && (this_profile != this->m_profile)) {
                if ((right == this) || (pOStack_60 == this)) {
                  if (this->m_profile != (ON_Curve *)0x0) {
                    (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
                  }
                }
                else {
                  local_168 = this->m_profile;
                }
              }
              this->m_profile = (ON_Curve *)0x0;
              if (right == (ON_Extrusion *)0x0) {
                right = (ON_Extrusion *)operator_new(0xd0);
                ON_Extrusion(right,this);
              }
              else if (right != this) {
                operator=(right,this);
              }
              if (pOStack_60 == (ON_Extrusion *)0x0) {
                pOStack_60 = (ON_Extrusion *)operator_new(0xd0);
                ON_Extrusion(pOStack_60,this);
              }
              else if (pOStack_60 != this) {
                operator=(pOStack_60,this);
              }
              this->m_profile = local_168;
              right->m_profile = right_profile;
              pOStack_60->m_profile = this_profile;
              *west_or_south_side = &right->super_ON_Surface;
              *(ON_Extrusion **)domain.m_t[1] = pOStack_60;
              bVar2 = 1;
            }
            this_local._7_1_ = bVar2;
          }
          else {
            this_local._7_1_ = 0;
          }
        }
        else {
          this_local._7_1_ = 0;
        }
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_004f6833:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ON_Extrusion::Split(
       int dir,
       double c,
       ON_Surface*& west_or_south_side,
       ON_Surface*& east_or_north_side
       ) const
{
  if ( dir < 0 || dir > 1 || !ON_IsValid(c) )
    return false;
  if ( 0 != west_or_south_side && west_or_south_side == east_or_north_side )
    return false;

  ON_Interval domain = Domain(dir);
  double s = domain.NormalizedParameterAt(c);
  if ( s <= 0.0 || s >= 1.0 )
    return false;
  if (c <= domain[0] || c >= domain[1] )
    return false;

  ON_Extrusion* left = 0;
  ON_Extrusion* right = 0;
  if ( west_or_south_side )
  {
    left = ON_Extrusion::Cast(west_or_south_side);
    if ( !left )
      return false;
  }
  if ( east_or_north_side )
  {
    right = ON_Extrusion::Cast(east_or_north_side);
    if ( !right )
      return false;
  }

  const int path_dir = PathParameter();
  bool rc = false;
  if ( dir == path_dir )
  {
    // split path
    ON_Line left_path, right_path;
    ON_Interval left_domain, right_domain;
    ON_Interval left_t, right_t;

    const double t0 = m_t[0];
    const double t1 = m_t[1];
    const double t = (1.0-s)*t0 + s*t1;
    if ( !ON_IsValid(t) || t <= t0 || t >= t1 )
      return false;

    ON_3dPoint P = m_path.PointAt(s);
    left_path.from = m_path.from;
    left_path.to = P;
    right_path.from = P;
    right_path.to = m_path.to;
    left_domain.Set(domain[0],c);
    right_domain.Set(c,domain[1]);
    left_t.Set(t0,t);
    right_t.Set(t,t1);
    if ( !left_path.IsValid() || left_path.Length() <= m_path_length_min )
      return false;
    if ( !right_path.IsValid() || right_path.Length() <= m_path_length_min )
      return false;

    // return result
    if ( !left )
      left = new ON_Extrusion(*this);
    else if ( left != this )
      left->operator =(*this);
    else
      left->DestroyRuntimeCache();
    if ( !right )
      right = new ON_Extrusion(*this);
    else if ( right != this )
      right->operator =(*this);
    else
      right->DestroyRuntimeCache();
    left->m_path = left_path;
    left->m_path_domain = left_domain;
    left->m_t = left_t;
    right->m_path = right_path;
    right->m_path_domain = right_domain;
    right->m_t = right_t;

    west_or_south_side = left;
    east_or_north_side = right;
    rc = true;
  }
  else
  {
    if ( 0 == m_profile )
      return false;
    ON_Curve* left_profile = 0;
    ON_Curve* right_profile = 0;

    if ( left == this )
    {
      left_profile = left->m_profile;
      left->DestroyRuntimeCache();
    }
    else if ( 0 != left && 0 != left->m_profile )
    {
      delete left->m_profile;
      left->m_profile = 0;
    }

    if ( right == this )
    {
      right_profile = right->m_profile;
      right->DestroyRuntimeCache();
    }
    else if ( 0 != right && 0 != right->m_profile )
    {
      delete right->m_profile;
      right->m_profile = 0;
    }

    if ( !m_profile->Split(c,left_profile,right_profile) )
      return false;
    if ( 0 == left_profile || 0 == right_profile )
    {
      if ( 0 != left_profile && m_profile != left_profile )
        delete left_profile;
      if ( 0 != right_profile && m_profile != right_profile )
        delete right_profile;
      return false;
    }

    ON_Curve* this_profile = 0;
    if ( left_profile != m_profile && right_profile != m_profile )
    {
      if ( left == this || right == this )
      {
        delete m_profile;
      }
      else
      {
        this_profile = m_profile;
      }
    }

    // Prevent this m_profile from being copied
    const_cast<ON_Extrusion*>(this)->m_profile = 0;

    // Create new left and right sides with nullptr profiles
    if ( !left )
      left = new ON_Extrusion(*this);
    else if ( left != this )
      left->operator =(*this);
    if ( !right )
      right = new ON_Extrusion(*this);
    else if ( right != this )
      right->operator =(*this);

    // Restore this m_profile
    const_cast<ON_Extrusion*>(this)->m_profile = this_profile;

    // Set left and right profiles
    left->m_profile = left_profile;
    right->m_profile = right_profile;

    west_or_south_side = left;
    east_or_north_side = right;
    rc = true;
  }

  return rc;
}